

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O2

void subip_u16n(uint16_t *a,uint16_t *b,size_t na,size_t nb)

{
  uint16_t *puVar1;
  uint16_t uVar2;
  ushort uVar3;
  ushort uVar4;
  bool bVar5;
  size_t sVar6;
  size_t sVar7;
  bool bVar8;
  
  bVar5 = false;
  while( true ) {
    sVar6 = na - 1;
    sVar7 = nb - 1;
    if ((nb == 0) || (na == 0)) break;
    uVar3 = a[sVar6];
    uVar4 = b[sVar7];
    nb = sVar7;
    na = sVar6;
    if (bVar5) {
      bVar5 = uVar3 <= uVar4;
      a[sVar6] = ~uVar4 + uVar3;
    }
    else {
      a[sVar6] = uVar3 - uVar4;
      if (uVar3 < uVar4) {
        bVar5 = true;
      }
    }
  }
  while (bVar8 = nb != 0, nb = nb - 1, bVar8) {
    if (b[nb] != 0) {
      __assert_fail("!b[ib]",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x4be,"void subip_u16n(uint16_t *, const uint16_t *, size_t, size_t)");
    }
  }
  while ((bVar8 = na != 0, na = na - 1, bVar8 && (bVar5))) {
    puVar1 = a + na;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 - 1;
    if (uVar2 != 0) {
      bVar5 = false;
    }
  }
  if (bVar5) {
    __assert_fail("!carry",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                  ,0x4ca,"void subip_u16n(uint16_t *, const uint16_t *, size_t, size_t)");
  }
  return;
}

Assistant:

static void subip_u16n(uint16_t *a, const uint16_t *b, size_t na, size_t nb)
{
	bool carry = false;
	size_t ia = na, ib = nb;

	while (ib > 0 && ia > 0) {
		--ia;
		--ib;
		if (carry) {
			if (a[ia] > b[ib]) {
				a[ia] -= b[ib] + 1;
				carry = false;
			} else {
				a[ia] += (uint16_t)65535 - b[ib];
				carry = true;
			}
		} else if (a[ia] >= b[ib]) {
			a[ia] -= b[ib];
		} else {
			a[ia] += (uint16_t)65535 - (b[ib] - 1);
			carry = true;
		}
	}
#ifndef NDEBUG
	while (ib > 0) {
		--ib;
		assert(!b[ib]);
	}
#endif
	while (ia > 0 && carry) {
		--ia;
		if (a[ia]) {
			a[ia] -= 1;
			carry = false;
		} else {
			a[ia] = 65535;
		}
	}
	assert(!carry);
}